

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

QJsonObject __thiscall ClassDef::toJson(ClassDef *this)

{
  QByteArrayView ba;
  QByteArrayView ba_00;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  QLatin1StringView key_02;
  QLatin1StringView key_03;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  QLatin1StringView latin1_02;
  QLatin1StringView key_04;
  QLatin1StringView key_05;
  QLatin1StringView key_06;
  QLatin1StringView key_07;
  QLatin1StringView key_08;
  QLatin1StringView key_09;
  QLatin1StringView key_10;
  QLatin1StringView key_11;
  QLatin1StringView key_12;
  QLatin1StringView key_13;
  QLatin1StringView key_14;
  bool bVar1;
  qsizetype qVar2;
  const_iterator o;
  QByteArrayView *in_RSI;
  QExplicitlySharedDataPointer<QCborContainerPrivate> in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  Interface *iface;
  QList<ClassDef::Interface> *__range2;
  QList<ClassDef::Interface> *ifaceList;
  QList<QList<ClassDef::Interface>_> *__range1_4;
  EnumDef *enumDef;
  add_const_t<const_QList<EnumDef>_> *__range1_3;
  SuperClass *super;
  add_const_t<const_QList<SuperClass>_> *__range1_2;
  PropertyDef *propDef;
  add_const_t<const_QList<PropertyDef>_> *__range1_1;
  ClassInfoDef *info;
  add_const_t<const_QList<ClassInfoDef>_> *__range1;
  QJsonObject *cls;
  QJsonObject ifaceJson;
  const_iterator __end2;
  const_iterator __begin2;
  QJsonArray jsonList;
  const_iterator __end1_4;
  const_iterator __begin1_4;
  QJsonArray ifaces;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  QJsonArray enums;
  QJsonObject superCls;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  QJsonArray superClasses;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  QJsonArray props;
  anon_class_16_2_d6ba3f70 appendFunctions;
  int methodIndex;
  QJsonObject infoJson;
  const_iterator __end1;
  const_iterator __begin1;
  QJsonArray classInfos;
  undefined7 in_stack_fffffffffffff888;
  undefined1 in_stack_fffffffffffff88f;
  QCborContainerPrivate *val;
  undefined1 in_stack_fffffffffffff8a8 [16];
  char *in_stack_fffffffffffff8c0;
  storage_type *in_stack_fffffffffffff8c8;
  undefined8 in_stack_fffffffffffff908;
  QJsonObject *in_stack_fffffffffffff910;
  undefined1 in_stack_fffffffffffff918 [16];
  QLatin1StringView in_stack_fffffffffffff928;
  const_iterator local_518;
  undefined1 *local_510;
  QList<ClassDef::Interface> *local_508;
  const_iterator local_500;
  const_iterator local_4f8;
  undefined1 *local_4f0;
  QJsonValueConstRef local_4e8;
  EnumDef *local_4d0;
  const_iterator local_4c8;
  const_iterator local_4c0;
  undefined1 *local_4b8;
  QJsonValueConstRef local_4b0;
  QJsonValueConstRef local_4a0;
  QJsonValueConstRef local_478;
  undefined1 *local_450;
  SuperClass *local_448;
  const_iterator local_440;
  const_iterator local_438;
  undefined1 *local_430;
  QJsonValueConstRef local_428;
  QJsonValueConstRef local_418;
  QJsonValueConstRef local_408;
  QJsonValueConstRef local_3f8;
  PropertyDef *local_3e0;
  const_iterator local_3d8;
  const_iterator local_3d0;
  undefined1 *local_3c8;
  undefined4 *local_358;
  undefined4 local_34c;
  QJsonValueConstRef local_348;
  QJsonValueConstRef local_338;
  QJsonValueConstRef local_310;
  undefined1 *local_2e8;
  ClassInfoDef *local_2e0;
  const_iterator local_2d8;
  const_iterator local_2d0;
  undefined1 *local_2c8;
  QJsonValueConstRef local_2c0;
  QJsonValueConstRef local_2b0;
  char *local_2a0;
  QJsonValueConstRef local_270;
  char *local_260;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  val = (QCborContainerPrivate *)in_RDI.d.ptr;
  QJsonObject::QJsonObject((QJsonObject *)0x15652d);
  local_260 = QByteArray::constData((QByteArray *)0x156537);
  QByteArrayView::QByteArrayView<const_char_*,_true>(in_RSI,(char **)val);
  ba.m_data = in_stack_fffffffffffff8c8;
  ba.m_size = (qsizetype)in_stack_fffffffffffff8c0;
  QString::fromUtf8(ba);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  QVar3.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  QVar3.m_data = in_stack_fffffffffffff8c0;
  local_270 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,QVar3);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
  QJsonValue::~QJsonValue((QJsonValue *)0x1565f3);
  QString::~QString((QString *)0x156600);
  local_2a0 = QByteArray::constData((QByteArray *)0x15660e);
  QByteArrayView::QByteArrayView<const_char_*,_true>(in_RSI,(char **)val);
  ba_00.m_data = in_stack_fffffffffffff8c8;
  ba_00.m_size = (qsizetype)in_stack_fffffffffffff8c0;
  QString::fromUtf8(ba_00);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  key.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  key.m_data = in_stack_fffffffffffff8c0;
  local_2b0 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
  QJsonValue::~QJsonValue((QJsonValue *)0x1566ca);
  QString::~QString((QString *)0x1566d7);
  QJsonValue::QJsonValue
            ((QJsonValue *)in_RDI.d.ptr,
             CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  key_00.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  key_00.m_data = in_stack_fffffffffffff8c0;
  local_2c0 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_00);
  QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
  QJsonValue::~QJsonValue((QJsonValue *)0x15675d);
  local_2c8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)0x156779);
  local_2d0.i = (ClassInfoDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_2d0 = QList<ClassInfoDef>::begin((QList<ClassInfoDef> *)in_RDI.d.ptr);
  local_2d8.i = (ClassInfoDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_2d8 = QList<ClassInfoDef>::end((QList<ClassInfoDef> *)in_RDI.d.ptr);
  while( true ) {
    local_2e0 = local_2d8.i;
    bVar1 = QList<ClassInfoDef>::const_iterator::operator!=(&local_2d0,local_2d8);
    if (!bVar1) break;
    QList<ClassInfoDef>::const_iterator::operator*(&local_2d0);
    local_2e8 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)0x156855);
    QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
    QJsonValue::QJsonValue
              ((QJsonValue *)in_RDI.d.ptr,
               (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_01.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_01.m_data = in_stack_fffffffffffff8c0;
    local_310 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_01);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x1568ef);
    QString::~QString((QString *)0x1568fc);
    QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
    QJsonValue::QJsonValue
              ((QJsonValue *)in_RDI.d.ptr,
               (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_02.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_02.m_data = in_stack_fffffffffffff8c0;
    local_338 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_02);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15699a);
    QString::~QString((QString *)0x1569a7);
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonObject *)val);
    QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x1569de);
    QJsonObject::~QJsonObject((QJsonObject *)0x1569eb);
    QList<ClassInfoDef>::const_iterator::operator++(&local_2d0);
  }
  qVar2 = QJsonArray::size((QJsonArray *)in_RDI.d.ptr);
  if (qVar2 != 0) {
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonArray *)val);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_03.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_03.m_data = in_stack_fffffffffffff8c0;
    local_348 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_03);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x156a96);
  }
  local_34c = 0;
  local_358 = &local_34c;
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  latin1.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  latin1.m_data = in_stack_fffffffffffff8c0;
  QString::QString((QString *)in_RSI,latin1);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (in_stack_fffffffffffff8a8._8_8_,in_stack_fffffffffffff8a8._0_8_,
             (QList<FunctionDef> *)in_RSI);
  QString::~QString((QString *)0x156b48);
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  latin1_00.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  latin1_00.m_data = in_stack_fffffffffffff8c0;
  QString::QString((QString *)in_RSI,latin1_00);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (in_stack_fffffffffffff8a8._8_8_,in_stack_fffffffffffff8a8._0_8_,
             (QList<FunctionDef> *)in_RSI);
  QString::~QString((QString *)0x156bb4);
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  latin1_01.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  latin1_01.m_data = in_stack_fffffffffffff8c0;
  QString::QString((QString *)in_RSI,latin1_01);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (in_stack_fffffffffffff8a8._8_8_,in_stack_fffffffffffff8a8._0_8_,
             (QList<FunctionDef> *)in_RSI);
  QString::~QString((QString *)0x156c20);
  local_34c = 0;
  Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
  latin1_02.m_size = (qsizetype)in_stack_fffffffffffff8c8;
  latin1_02.m_data = in_stack_fffffffffffff8c0;
  QString::QString((QString *)in_RSI,latin1_02);
  toJson::anon_class_16_2_d6ba3f70::operator()
            (in_stack_fffffffffffff8a8._8_8_,in_stack_fffffffffffff8a8._0_8_,
             (QList<FunctionDef> *)in_RSI);
  QString::~QString((QString *)0x156c97);
  local_3c8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)0x156cb3);
  local_3d0.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_3d0 = QList<PropertyDef>::begin((QList<PropertyDef> *)in_RDI.d.ptr);
  local_3d8.i = (PropertyDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_3d8 = QList<PropertyDef>::end((QList<PropertyDef> *)in_RDI.d.ptr);
  while( true ) {
    local_3e0 = local_3d8.i;
    bVar1 = QList<PropertyDef>::const_iterator::operator!=(&local_3d0,local_3d8);
    if (!bVar1) break;
    QList<PropertyDef>::const_iterator::operator*(&local_3d0);
    PropertyDef::toJson(in_stack_fffffffffffff918._0_8_);
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonObject *)val);
    QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x156dc1);
    QJsonObject::~QJsonObject((QJsonObject *)0x156dce);
    QList<PropertyDef>::const_iterator::operator++(&local_3d0);
  }
  bVar1 = QJsonArray::isEmpty((QJsonArray *)in_RSI);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonArray *)val);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_04.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_04.m_data = in_stack_fffffffffffff8c0;
    local_3f8 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_04);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x156e77);
  }
  if ((in_RSI[0x1a].m_size & 0x100000000) != 0) {
    QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,(bool)in_stack_fffffffffffff88f);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_05.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_05.m_data = in_stack_fffffffffffff8c0;
    local_408 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_05);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x156f04);
  }
  if ((in_RSI[0x1a].m_size & 0x10000000000) != 0) {
    QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,(bool)in_stack_fffffffffffff88f);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_06.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_06.m_data = in_stack_fffffffffffff8c0;
    local_418 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_06);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x156f91);
  }
  if ((in_RSI[0x1a].m_size & 0x1000000000000) != 0) {
    QJsonValue::QJsonValue((QJsonValue *)in_RDI.d.ptr,(bool)in_stack_fffffffffffff88f);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_07.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_07.m_data = in_stack_fffffffffffff8c0;
    local_428 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_07);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x15701e);
  }
  local_430 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)0x15703a);
  local_438.i = (SuperClass *)&DAT_aaaaaaaaaaaaaaaa;
  local_438 = QList<SuperClass>::begin((QList<SuperClass> *)in_RDI.d.ptr);
  local_440.i = (SuperClass *)&DAT_aaaaaaaaaaaaaaaa;
  local_440 = QList<SuperClass>::end((QList<SuperClass> *)in_RDI.d.ptr);
  while( true ) {
    local_448 = local_440.i;
    bVar1 = QList<SuperClass>::const_iterator::operator!=(&local_438,local_440);
    if (!bVar1) break;
    QList<SuperClass>::const_iterator::operator*(&local_438);
    local_450 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)0x157118);
    QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
    QJsonValue::QJsonValue
              ((QJsonValue *)in_RDI.d.ptr,
               (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_08.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_08.m_data = in_stack_fffffffffffff8c0;
    local_478 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_08);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x1571b2);
    QString::~QString((QString *)0x1571bf);
    bVar1 = ::operator!=(in_stack_fffffffffffff8a8._0_8_,(QByteArray *)in_RSI);
    if (bVar1) {
      QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
      QJsonValue::QJsonValue
                ((QJsonValue *)in_RDI.d.ptr,
                 (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
      in_stack_fffffffffffff928 =
           Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
      key_09.m_size = (qsizetype)in_stack_fffffffffffff8c8;
      key_09.m_data = in_stack_fffffffffffff8c0;
      local_4a0 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_09);
      QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
      QJsonValue::~QJsonValue((QJsonValue *)0x15727f);
      QString::~QString((QString *)0x15728c);
    }
    FunctionDef::accessToJson
              (in_stack_fffffffffffff910,(Access)((ulong)in_stack_fffffffffffff908 >> 0x20));
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonObject *)val);
    QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x1572db);
    QJsonObject::~QJsonObject((QJsonObject *)0x1572e8);
    QList<SuperClass>::const_iterator::operator++(&local_438);
  }
  bVar1 = QJsonArray::isEmpty((QJsonArray *)in_RSI);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonArray *)val);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_10.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_10.m_data = in_stack_fffffffffffff8c0;
    local_4b0 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_10);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x157391);
  }
  local_4b8 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)0x1573ad);
  local_4c0.i = (EnumDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_4c0 = QList<EnumDef>::begin((QList<EnumDef> *)in_RDI.d.ptr);
  local_4c8.i = (EnumDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_4c8 = QList<EnumDef>::end((QList<EnumDef> *)in_RDI.d.ptr);
  while( true ) {
    local_4d0 = local_4c8.i;
    bVar1 = QList<EnumDef>::const_iterator::operator!=(&local_4c0,local_4c8);
    if (!bVar1) break;
    QList<EnumDef>::const_iterator::operator*(&local_4c0);
    EnumDef::toJson((EnumDef *)in_stack_fffffffffffff928.m_size,
                    (ClassDef *)in_stack_fffffffffffff928.m_data);
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonObject *)val);
    QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x1574be);
    QJsonObject::~QJsonObject((QJsonObject *)0x1574cb);
    QList<EnumDef>::const_iterator::operator++(&local_4c0);
  }
  bVar1 = QJsonArray::isEmpty((QJsonArray *)in_RSI);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonArray *)val);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_11.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_11.m_data = in_stack_fffffffffffff8c0;
    local_4e8 = (QJsonValueConstRef)QJsonObject::operator[]((QJsonObject *)val,key_11);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x157564);
  }
  local_4f0 = &DAT_aaaaaaaaaaaaaaaa;
  QJsonArray::QJsonArray((QJsonArray *)0x157580);
  local_4f8.i = (QList<ClassDef::Interface> *)&DAT_aaaaaaaaaaaaaaaa;
  local_4f8 = QList<QList<ClassDef::Interface>_>::begin
                        ((QList<QList<ClassDef::Interface>_> *)in_RDI.d.ptr);
  local_500.i = (QList<ClassDef::Interface> *)&DAT_aaaaaaaaaaaaaaaa;
  local_500 = QList<QList<ClassDef::Interface>_>::end
                        ((QList<QList<ClassDef::Interface>_> *)in_RDI.d.ptr);
  while( true ) {
    local_508 = local_500.i;
    bVar1 = QList<QList<ClassDef::Interface>_>::const_iterator::operator!=(&local_4f8,local_500);
    if (!bVar1) break;
    QList<QList<ClassDef::Interface>_>::const_iterator::operator*(&local_4f8);
    local_510 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)0x15764c);
    local_518.i = (Interface *)&DAT_aaaaaaaaaaaaaaaa;
    local_518 = QList<ClassDef::Interface>::begin((QList<ClassDef::Interface> *)in_RDI.d.ptr);
    o = QList<ClassDef::Interface>::end((QList<ClassDef::Interface> *)in_RDI.d.ptr);
    while (bVar1 = QList<ClassDef::Interface>::const_iterator::operator!=(&local_518,o), bVar1) {
      QList<ClassDef::Interface>::const_iterator::operator*(&local_518);
      QJsonObject::QJsonObject((QJsonObject *)0x157712);
      QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
      QJsonValue::QJsonValue
                ((QJsonValue *)in_RDI.d.ptr,
                 (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
      QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
      in_stack_fffffffffffff8c8 = QVar3.m_data;
      key_12.m_size = (qsizetype)in_stack_fffffffffffff8c8;
      key_12.m_data = in_stack_fffffffffffff8c0;
      QJsonObject::operator[]((QJsonObject *)val,key_12);
      QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
      QJsonValue::~QJsonValue((QJsonValue *)0x1577a1);
      QString::~QString((QString *)0x1577ae);
      QString::fromUtf8<void>((QByteArray *)in_RDI.d.ptr);
      QJsonValue::QJsonValue
                ((QJsonValue *)in_RDI.d.ptr,
                 (QString *)CONCAT17(in_stack_fffffffffffff88f,in_stack_fffffffffffff888));
      QVar3 = Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
      in_stack_fffffffffffff8c0 = (char *)QVar3.m_size;
      key_13.m_size = (qsizetype)in_stack_fffffffffffff8c8;
      key_13.m_data = in_stack_fffffffffffff8c0;
      QJsonObject::operator[]((QJsonObject *)val,key_13);
      QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
      QJsonValue::~QJsonValue((QJsonValue *)0x157839);
      QString::~QString((QString *)0x157846);
      QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonObject *)val);
      QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
      QJsonValue::~QJsonValue((QJsonValue *)0x15787d);
      QJsonObject::~QJsonObject((QJsonObject *)0x15788a);
      QList<ClassDef::Interface>::const_iterator::operator++(&local_518);
    }
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonArray *)val);
    QJsonArray::append((QJsonArray *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x1578d3);
    QJsonArray::~QJsonArray((QJsonArray *)0x1578e0);
    QList<QList<ClassDef::Interface>_>::const_iterator::operator++(&local_4f8);
  }
  bVar1 = QJsonArray::isEmpty((QJsonArray *)in_RSI);
  if (!bVar1) {
    QJsonValue::QJsonValue((QJsonValue *)in_RSI,(QJsonArray *)val);
    Qt::Literals::StringLiterals::operator____L1((char *)val,(size_t)in_RDI.d.ptr);
    key_14.m_size = (qsizetype)in_stack_fffffffffffff8c8;
    key_14.m_data = in_stack_fffffffffffff8c0;
    QJsonObject::operator[]((QJsonObject *)val,key_14);
    QJsonValueRef::operator=((QJsonValueRef *)in_RSI,(QJsonValue *)val);
    QJsonValue::~QJsonValue((QJsonValue *)0x157979);
  }
  QJsonArray::~QJsonArray((QJsonArray *)0x15798e);
  QJsonArray::~QJsonArray((QJsonArray *)0x15799b);
  QJsonArray::~QJsonArray((QJsonArray *)0x1579a8);
  QJsonArray::~QJsonArray((QJsonArray *)0x1579b5);
  QJsonArray::~QJsonArray((QJsonArray *)0x1579c2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)in_RDI.d.ptr;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject ClassDef::toJson() const
{
    QJsonObject cls;
    cls["className"_L1] = QString::fromUtf8(classname.constData());
    cls["qualifiedClassName"_L1] = QString::fromUtf8(qualified.constData());
    cls["lineNumber"_L1] = lineNumber;

    QJsonArray classInfos;
    for (const auto &info: std::as_const(classInfoList)) {
        QJsonObject infoJson;
        infoJson["name"_L1] = QString::fromUtf8(info.name);
        infoJson["value"_L1] = QString::fromUtf8(info.value);
        classInfos.append(infoJson);
    }

    if (classInfos.size())
        cls["classInfos"_L1] = classInfos;

    int methodIndex = 0;
    const auto appendFunctions
            = [&cls, &methodIndex](const QString &type, const QList<FunctionDef> &funcs) {
        QJsonArray jsonFuncs;

        for (const FunctionDef &fdef: funcs)
            jsonFuncs.append(fdef.toJson(methodIndex++));

        if (!jsonFuncs.isEmpty())
            cls[type] = jsonFuncs;
    };

    // signals, slots, and methods, in this order, follow the same index
    appendFunctions("signals"_L1, signalList);
    appendFunctions("slots"_L1, slotList);
    appendFunctions("methods"_L1, methodList);

    // constructors are indexed separately.
    methodIndex = 0;
    appendFunctions("constructors"_L1, constructorList);

    QJsonArray props;

    for (const PropertyDef &propDef: std::as_const(propertyList))
        props.append(propDef.toJson());

    if (!props.isEmpty())
        cls["properties"_L1] = props;

    if (hasQObject)
        cls["object"_L1] = true;
    if (hasQGadget)
        cls["gadget"_L1] = true;
    if (hasQNamespace)
        cls["namespace"_L1] = true;

    QJsonArray superClasses;

    for (const auto &super: std::as_const(superclassList)) {
        QJsonObject superCls;
        superCls["name"_L1] = QString::fromUtf8(super.classname);
        if (super.classname != super.qualified)
            superCls["fullyQualifiedName"_L1] = QString::fromUtf8(super.qualified);
        FunctionDef::accessToJson(&superCls, super.access);
        superClasses.append(superCls);
    }

    if (!superClasses.isEmpty())
        cls["superClasses"_L1] = superClasses;

    QJsonArray enums;
    for (const EnumDef &enumDef: std::as_const(enumList))
        enums.append(enumDef.toJson(*this));
    if (!enums.isEmpty())
        cls["enums"_L1] = enums;

    QJsonArray ifaces;
    for (const QList<Interface> &ifaceList : interfaceList) {
        QJsonArray jsonList;
        for (const Interface &iface: ifaceList) {
            QJsonObject ifaceJson;
            ifaceJson["id"_L1] = QString::fromUtf8(iface.interfaceId);
            ifaceJson["className"_L1] = QString::fromUtf8(iface.className);
            jsonList.append(ifaceJson);
        }
        ifaces.append(jsonList);
    }
    if (!ifaces.isEmpty())
        cls["interfaces"_L1] = ifaces;

    return cls;
}